

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier.cpp
# Opt level: O3

bool __thiscall
license::hw_identifier::HwIdentifier::data_match(HwIdentifier *this,array<unsigned_char,_7UL> *data)

{
  ulong uVar1;
  bool bVar2;
  
  uVar1 = 0;
  do {
    bVar2 = (((this->m_data)._M_elems[1] ^ data->_M_elems[0]) & 0x1f) == 0;
    if (uVar1 != 0) {
      bVar2 = data->_M_elems[uVar1] == (this->m_data)._M_elems[uVar1 + 1];
    }
  } while ((uVar1 < 6) && (uVar1 = uVar1 + 1, bVar2 != false));
  return bVar2;
}

Assistant:

bool HwIdentifier::data_match(const std::array<uint8_t, HW_IDENTIFIER_PROPRIETARY_DATA>& data) const {
	bool equals = true;
	for (int i = 0; i < HW_IDENTIFIER_PROPRIETARY_DATA && equals; i++) {
		equals = (i == 0) ? ((data[i] & 0x1f) == (m_data[i + 1] & 0x1f)) : (data[i] == m_data[i + 1]);
	}
	return equals;
}